

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O3

bool ON_IsKnotVectorUniform(int order,int cv_count,double *knot)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  bVar2 = false;
  if (((order <= cv_count) && (bVar2 = false, 1 < order)) && (knot != (double *)0x0)) {
    dVar8 = knot[(ulong)(uint)order - 2];
    dVar7 = knot[(ulong)(uint)order - 1] - dVar8;
    bVar2 = false;
    if (((dVar7 < 1.23432101234321e+308) && ((dVar7 != 0.0 || (NAN(dVar7))))) &&
       (-1.23432101234321e+308 < dVar7)) {
      uVar4 = order;
      if (*knot != dVar8) {
        uVar4 = 1;
      }
      if (NAN(*knot) || NAN(dVar8)) {
        uVar4 = 1;
      }
      iVar3 = cv_count + -2 + order;
      iVar6 = cv_count;
      if (knot[(ulong)(uint)cv_count - 1] != knot[(ulong)(uint)(cv_count + order) - 3]) {
        iVar6 = iVar3;
      }
      if (NAN(knot[(ulong)(uint)cv_count - 1]) || NAN(knot[(ulong)(uint)(cv_count + order) - 3])) {
        iVar6 = iVar3;
      }
      bVar2 = true;
      if ((int)uVar4 < iVar6) {
        pdVar5 = knot + uVar4;
        dVar8 = pdVar5[-1];
        do {
          uVar4 = uVar4 + 1;
          dVar1 = *pdVar5;
          dVar9 = ABS((dVar1 - dVar8) - dVar7);
          bVar2 = dVar9 <= ABS(dVar7 * 1.490116119385e-08);
          if (iVar6 <= (int)uVar4) {
            return bVar2;
          }
          pdVar5 = pdVar5 + 1;
          dVar8 = dVar1;
        } while (dVar9 <= ABS(dVar7 * 1.490116119385e-08));
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_IsKnotVectorUniform(
          int order,
          int cv_count,
          const double* knot 
          )
{
  bool rc = (order >= 2 && cv_count >= order && 0 != knot);
  if (rc)
  {
    const double delta = knot[order-1] - knot[order-2];
    rc = (0.0 != delta && delta > ON_UNSET_VALUE && delta < ON_UNSET_POSITIVE_VALUE);
    if (rc)
    {
      const int i0 = ON_IsKnotVectorClamped(order, cv_count, knot, 0) ? order : 1;
      const int i1 = ON_IsKnotVectorClamped(order, cv_count, knot, 1) ? cv_count : ON_KnotCount(order, cv_count);
      double k0 = knot[i0 - 1];
      const double delta_tol = fabs(ON_SQRT_EPSILON*delta);
      for (int i = i0; i < i1 && rc; ++i)
      {
        const double d = knot[i] - k0;
        rc = fabs(d - delta) <= delta_tol;
        k0 = knot[i];
      }
    }
  }
  return rc;
}